

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat R_z(double Angle)

{
  double *extraout_RDX;
  Mat *in_RDI;
  double dVar1;
  double dVar2;
  Mat MVar3;
  double S;
  double C;
  double Angle_local;
  Mat *U;
  
  dVar1 = cos(Angle);
  dVar2 = sin(Angle);
  Mat::Mat(in_RDI,3,3);
  *in_RDI->v_ = dVar1;
  in_RDI->v_[1] = dVar2;
  in_RDI->v_[2] = 0.0;
  in_RDI->v_[3] = -dVar2;
  in_RDI->v_[4] = dVar1;
  in_RDI->v_[5] = 0.0;
  in_RDI->v_[6] = 0.0;
  in_RDI->v_[7] = 0.0;
  in_RDI->v_[8] = 1.0;
  MVar3.v_ = extraout_RDX;
  MVar3._0_8_ = in_RDI;
  return MVar3;
}

Assistant:

Mat R_z(double Angle)
{
	const double C = cos(Angle);
	const double S = sin(Angle);
	Mat U(3,3);
	U.v_[0] =  +C;
	U.v_[1] =  +S;
	U.v_[2] = 0.0;
	U.v_[3] =  -S;
	U.v_[4] =  +C;
	U.v_[5] = 0.0;
	U.v_[6] = 0.0;
	U.v_[7] = 0.0;
	U.v_[8] = 1.0;
	return U;
}